

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::getShaderStageName_abi_cxx11_
          (string *__return_storage_ptr__,InputVariablesCannotBeModifiedTest *this,
          _shader_stage stage)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?!","");
  if (stage < (SHADER_STAGE_VERTEX|SHADER_STAGE_GEOMETRY)) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_01ab0f98 + *(int *)(&DAT_01ab0f98 + (ulong)stage * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputVariablesCannotBeModifiedTest::getShaderStageName(_shader_stage stage) const
{
	std::string result = "?!";

	switch (stage)
	{
	case SHADER_STAGE_FRAGMENT:
		result = "fragment shader";
		break;
	case SHADER_STAGE_GEOMETRY:
		result = "geometry shader";
		break;
	case SHADER_STAGE_TESSELLATION_CONTROL:
		result = "tessellation control shader";
		break;
	case SHADER_STAGE_TESSELLATION_EVALUATION:
		result = "tessellation evaluation shader";
		break;
	case SHADER_STAGE_VERTEX:
		result = "vertex shader";
		break;
	} /* switch (stage) */

	return result;
}